

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

Token * __thiscall
EOPlus::Parser_Token_Server_Base::GetToken
          (Token *__return_storage_ptr__,Parser_Token_Server_Base *this,uint allow)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TokenType TVar2;
  int iVar3;
  _Elt_pointer pTVar4;
  Token t;
  TokenType local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  char *local_188;
  size_type local_180;
  char local_178;
  undefined7 uStack_177;
  undefined8 uStack_170;
  bool local_168;
  bool bStack_167;
  bool bStack_166;
  bool bStack_165;
  bool bStack_164;
  undefined3 uStack_163;
  var_type local_160;
  int local_158;
  variant local_150;
  TokenType local_110 [2];
  undefined8 local_108;
  double dStack_100;
  long *local_f8 [2];
  long local_e8 [3];
  var_type local_d0;
  int local_c8;
  undefined1 local_c0 [24];
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  bool local_88;
  bool bStack_87;
  bool bStack_86;
  bool bStack_85;
  bool bStack_84;
  undefined3 uStack_83;
  var_type local_80;
  int local_78;
  variant local_70;
  
  util::variant::variant(&local_70);
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,local_70.val_string._M_dataplus._M_p,
             local_70.val_string._M_dataplus._M_p + local_70.val_string._M_string_length);
  local_160 = local_70.type;
  local_168 = local_70.val_bool;
  bStack_167 = local_70.cache_val[0];
  bStack_166 = local_70.cache_val[1];
  bStack_165 = local_70.cache_val[2];
  bStack_164 = local_70.cache_val[3];
  uStack_163 = local_70._53_3_;
  local_158 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.val_string._M_dataplus._M_p != &local_70.val_string.field_2) {
    operator_delete(local_70.val_string._M_dataplus._M_p,
                    local_70.val_string.field_2._M_allocated_capacity + 1);
  }
  TVar2 = allow & NewLine;
  iVar3 = 0;
  while( true ) {
    pTVar4 = (this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pTVar4 == (this->token_buffer).c.
                  super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) {
      (**this->_vptr_Parser_Token_Server_Base)(local_110,this);
      local_1a0 = local_110[0];
      local_198 = local_108;
      uStack_190 = dStack_100;
      std::__cxx11::string::operator=((string *)&local_188,(string *)local_f8);
      local_160 = local_d0;
      local_168 = (bool)(undefined1)local_e8[2];
      bStack_167 = (bool)local_e8[2]._1_1_;
      bStack_166 = (bool)local_e8[2]._2_1_;
      bStack_165 = (bool)local_e8[2]._3_1_;
      bStack_164 = (bool)local_e8[2]._4_1_;
      uStack_163 = local_e8[2]._5_3_;
      local_158 = local_c8;
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0],local_e8[0] + 1);
      }
    }
    else {
      if (pTVar4 == (this->token_buffer).c.
                    super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        pTVar4 = (this->token_buffer).c.
                 super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 6;
      }
      local_1a0 = pTVar4[-1].type;
      local_198 = *(undefined8 *)&pTVar4[-1].data;
      uStack_190 = pTVar4[-1].data.val_float;
      std::__cxx11::string::_M_assign((string *)&local_188);
      local_160 = pTVar4[-1].data.type;
      local_168 = pTVar4[-1].data.val_bool;
      bStack_167 = pTVar4[-1].data.cache_val[0];
      bStack_166 = pTVar4[-1].data.cache_val[1];
      bStack_165 = pTVar4[-1].data.cache_val[2];
      bStack_164 = pTVar4[-1].data.cache_val[3];
      uStack_163 = *(undefined3 *)&pTVar4[-1].data.field_0x35;
      local_158 = pTVar4[-1].newlines;
      std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::pop_back(&(this->token_buffer).c);
    }
    if (local_1a0 != NewLine) break;
    this->line = this->line + 1;
    if (TVar2 != Invalid) {
      iVar3 = 0;
LAB_0013cdf6:
      local_158 = iVar3;
      if (TVar2 == local_1a0) {
        __return_storage_ptr__->type = local_1a0;
        *(undefined8 *)&__return_storage_ptr__->data = local_198;
        (__return_storage_ptr__->data).val_float = uStack_190;
        paVar1 = &(__return_storage_ptr__->data).val_string.field_2;
        (__return_storage_ptr__->data).val_string._M_dataplus._M_p = (pointer)paVar1;
        if (local_188 == &local_178) {
          paVar1->_M_allocated_capacity = CONCAT71(uStack_177,local_178);
          *(undefined8 *)((long)&(__return_storage_ptr__->data).val_string.field_2 + 8) = uStack_170
          ;
        }
        else {
          (__return_storage_ptr__->data).val_string._M_dataplus._M_p = local_188;
          (__return_storage_ptr__->data).val_string.field_2._M_allocated_capacity =
               CONCAT71(uStack_177,local_178);
        }
        (__return_storage_ptr__->data).val_string._M_string_length = local_180;
        local_180 = 0;
        local_178 = '\0';
        (__return_storage_ptr__->data).type = local_160;
        (__return_storage_ptr__->data).val_bool = local_168;
        (__return_storage_ptr__->data).cache_val[0] = bStack_167;
        (__return_storage_ptr__->data).cache_val[1] = bStack_166;
        (__return_storage_ptr__->data).cache_val[2] = bStack_165;
        (__return_storage_ptr__->data).cache_val[3] = bStack_164;
        *(undefined3 *)&(__return_storage_ptr__->data).field_0x35 = uStack_163;
        __return_storage_ptr__->newlines = iVar3;
        local_188 = &local_178;
      }
      else {
        local_c0._0_4_ = local_1a0;
        local_c0._8_4_ = (int)local_198;
        local_c0._12_4_ = local_198._4_4_;
        local_c0._16_4_ = (undefined4)uStack_190;
        local_c0._20_4_ = uStack_190._4_4_;
        local_a8._M_p = (pointer)&local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,local_188,local_188 + local_180);
        local_80 = local_160;
        local_88 = local_168;
        bStack_87 = bStack_167;
        bStack_86 = bStack_166;
        bStack_85 = bStack_165;
        bStack_84 = bStack_164;
        uStack_83 = uStack_163;
        local_78 = local_158;
        PutBack(this,(Token *)local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_p != &local_98) {
          operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
        }
        util::variant::variant(&local_150);
        __return_storage_ptr__->type = Invalid;
        (__return_storage_ptr__->data).val_int = local_150.val_int;
        *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_150._4_4_;
        *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_150.val_float._0_4_;
        *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) =
             local_150.val_float._4_4_;
        (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->data).val_string.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(__return_storage_ptr__->data).val_string,
                   local_150.val_string._M_dataplus._M_p,
                   local_150.val_string._M_dataplus._M_p + local_150.val_string._M_string_length);
        (__return_storage_ptr__->data).type = local_150.type;
        (__return_storage_ptr__->data).val_bool = local_150.val_bool;
        (__return_storage_ptr__->data).cache_val[0] = local_150.cache_val[0];
        (__return_storage_ptr__->data).cache_val[1] = local_150.cache_val[1];
        (__return_storage_ptr__->data).cache_val[2] = local_150.cache_val[2];
        (__return_storage_ptr__->data).cache_val[3] = local_150.cache_val[3];
        *(undefined3 *)&(__return_storage_ptr__->data).field_0x35 = local_150._53_3_;
        __return_storage_ptr__->newlines = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150.val_string._M_dataplus._M_p != &local_150.val_string.field_2) {
          operator_delete(local_150.val_string._M_dataplus._M_p,
                          local_150.val_string.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_188 != &local_178) {
        operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
      }
      return __return_storage_ptr__;
    }
    iVar3 = iVar3 + 1;
  }
  TVar2 = allow & local_1a0;
  goto LAB_0013cdf6;
}

Assistant:

Token Parser_Token_Server_Base::GetToken(unsigned int allow)
	{
		Token t;
		int newlines = 0;

		while (true)
		{
			if (!this->token_buffer.empty())
			{
				t = this->token_buffer.top();
				this->token_buffer.pop();
			}
			else
			{
				t = this->xGetToken();
			}

			if (t.type == Token::NewLine)
			{
				++this->line;

				if ((Token::NewLine & allow) == Token::NewLine)
					break;

				++newlines;
			}
			else
			{
				break;
			}
		}

		t.newlines = newlines;

		if ((t.type & allow) != t.type)
		{
			this->PutBack(t);
			return Token();
		}

		return t;
	}